

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O1

void VP8ParseProba(VP8BitReader *br,VP8Decoder *dec)

{
  VP8BandProbas (*paVVar1) [8];
  range_t rVar2;
  ulong *puVar3;
  ulong uVar4;
  uint uVar5;
  uint8_t uVar6;
  long lVar8;
  long lVar9;
  byte bVar10;
  uint8_t (*paaauVar11) [8] [3] [11];
  uint8_t (*pauVar12) [11];
  uint uVar13;
  long lVar14;
  VP8BandProbas *pVVar15;
  VP8BandProbas *pVVar16;
  VP8BandProbas *pVVar17;
  VP8BandProbas *(*papVVar18) [17];
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint8_t (*paaauVar22) [8] [3] [11];
  uint8_t (*pauVar23) [11];
  uint8_t (*pauVar24) [11];
  uint8_t (*local_98) [11];
  uint32_t uVar7;
  
  paVVar1 = (dec->proba_).bands_;
  papVVar18 = (dec->proba_).bands_ptr_;
  paaauVar22 = CoeffsUpdateProba;
  paaauVar11 = CoeffsProba0;
  lVar19 = 0;
  pVVar15 = *paVVar1;
  do {
    lVar9 = 0;
    pauVar12 = (uint8_t (*) [11])paaauVar11;
    pVVar16 = pVVar15;
    pauVar23 = (uint8_t (*) [11])paaauVar22;
    do {
      lVar8 = 0;
      pVVar17 = pVVar16;
      pauVar24 = pauVar23;
      local_98 = pauVar12;
      do {
        lVar14 = 0;
        do {
          bVar10 = (*(uint8_t (*) [3] [11])*pauVar24)[0][lVar14];
          rVar2 = br->range_;
          if (br->bits_ < 0) {
            puVar3 = (ulong *)br->buf_;
            if (puVar3 < br->buf_max_) {
              uVar4 = *puVar3;
              br->buf_ = (uint8_t *)((long)puVar3 + 7);
              br->value_ = br->value_ << 0x38 |
                           ((uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
                            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
                            (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38)
                           >> 8;
              br->bits_ = br->bits_ + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          uVar20 = bVar10 * rVar2 >> 8;
          bVar10 = (byte)br->bits_;
          uVar13 = (uint)(br->value_ >> (bVar10 & 0x3f));
          if (uVar20 < uVar13) {
            uVar21 = rVar2 - uVar20;
            br->value_ = br->value_ - ((ulong)uVar20 + 1 << (bVar10 & 0x3f));
          }
          else {
            uVar21 = uVar20 + 1;
          }
          uVar5 = 0x1f;
          if (uVar21 != 0) {
            for (; uVar21 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          br->bits_ = br->bits_ - (uVar5 ^ 7);
          br->range_ = (uVar21 << ((byte)(uVar5 ^ 7) & 0x1f)) - 1;
          if (uVar20 < uVar13) {
            uVar7 = VP8GetValue(br,8);
            uVar6 = (uint8_t)uVar7;
          }
          else {
            uVar6 = (*(uint8_t (*) [3] [11])*local_98)[0][lVar14];
          }
          (*(VP8BandProbas (*) [8])pVVar17)[0].probas_[0][lVar14] = uVar6;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0xb);
        lVar8 = lVar8 + 1;
        pauVar24 = pauVar24 + 1;
        local_98 = local_98 + 1;
        pVVar17 = (VP8BandProbas *)((*(VP8BandProbas (*) [8])pVVar17)[0].probas_ + 1);
      } while (lVar8 != 3);
      lVar9 = lVar9 + 1;
      pauVar23 = pauVar23 + 3;
      pauVar12 = pauVar12 + 3;
      pVVar16 = pVVar16 + 1;
    } while (lVar9 != 8);
    lVar9 = 0;
    do {
      (*papVVar18)[lVar9] =
           (VP8BandProbas *)
           ((long)paVVar1[lVar19][0].probas_ + (ulong)""[lVar9] * 0x20 + (ulong)""[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x11);
    lVar19 = lVar19 + 1;
    paaauVar22 = (uint8_t (*) [8] [3] [11])((long)paaauVar22 + 0x108);
    paaauVar11 = (uint8_t (*) [8] [3] [11])((long)paaauVar11 + 0x108);
    pVVar15 = pVVar15 + 8;
    papVVar18 = papVVar18 + 1;
  } while (lVar19 != 4);
  uVar7 = VP8GetValue(br,1);
  dec->use_skip_proba_ = uVar7;
  if (uVar7 != 0) {
    uVar7 = VP8GetValue(br,8);
    dec->skip_p_ = (uint8_t)uVar7;
  }
  return;
}

Assistant:

void VP8ParseProba(VP8BitReader* const br, VP8Decoder* const dec) {
  VP8Proba* const proba = &dec->proba_;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const int v =
              VP8GetBit(br, CoeffsUpdateProba[t][b][c][p], "global-header") ?
                        VP8GetValue(br, 8, "global-header") :
                        CoeffsProba0[t][b][c][p];
          proba->bands_[t][b].probas_[c][p] = v;
        }
      }
    }
    for (b = 0; b < 16 + 1; ++b) {
      proba->bands_ptr_[t][b] = &proba->bands_[t][kBands[b]];
    }
  }
  dec->use_skip_proba_ = VP8Get(br, "global-header");
  if (dec->use_skip_proba_) {
    dec->skip_p_ = VP8GetValue(br, 8, "global-header");
  }
}